

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

void __thiscall CVmObjTable::gc_trace_globals(CVmObjTable *this)

{
  vm_obj_id_t id;
  size_t sVar1;
  size_t sVar2;
  CVmObjGlobPage *pCVar3;
  vm_globalvar_t *pvVar4;
  
  for (pCVar3 = this->globals_; pCVar3 != (CVmObjGlobPage *)0x0; pCVar3 = pCVar3->nxt_) {
    sVar1 = pCVar3->used_;
    if (sVar1 != 0) {
      sVar2 = 0;
      do {
        add_to_gc_queue(this,pCVar3->objs_[sVar2],2);
        sVar2 = sVar2 + 1;
      } while (sVar1 != sVar2);
    }
  }
  if ((r0_.typ == VM_OBJ) && (r0_.val.obj != 0)) {
    add_to_gc_queue(this,r0_.val.obj,2);
  }
  for (pvVar4 = this->global_var_head_; pvVar4 != (vm_globalvar_t *)0x0; pvVar4 = pvVar4->nxt) {
    if (((pvVar4->val).typ == VM_OBJ) && (id = (pvVar4->val).val.obj, id != 0)) {
      add_to_gc_queue(this,id,2);
    }
  }
  return;
}

Assistant:

void CVmObjTable::gc_trace_globals(VMG0_)
{
    CVmObjGlobPage *pg;
    vm_val_t *val;
    vm_globalvar_t *var;

    /* trace each page of globals */
    for (pg = globals_ ; pg != 0 ; pg = pg->nxt_)
    {
        size_t i;
        vm_obj_id_t *objp;

        /* trace each item on this page */
        for (objp = pg->objs_, i = pg->used_ ; i != 0 ; ++objp, --i)
        {
            /* trace this global */
            add_to_gc_queue(*objp, VMOBJ_REACHABLE);
        }
    }

    /* the return value register (R0) is a machine global */
    val = G_interpreter->get_r0();
    if (val->typ == VM_OBJ && val->val.obj != VM_INVALID_OBJ)
        add_to_gc_queue(val->val.obj, VMOBJ_REACHABLE);

    /* trace the global variables defined by other subsystems */
    for (var = global_var_head_ ; var != 0 ; var = var->nxt)
    {
        /* if this global variable contains an object, trace it */
        if (var->val.typ == VM_OBJ && var->val.val.obj != VM_INVALID_OBJ)
            add_to_gc_queue(var->val.val.obj, VMOBJ_REACHABLE);
    }
}